

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktMemoryPipelineBarrierTests.cpp
# Opt level: O2

bool __thiscall
vkt::memory::anon_unknown_0::MemoryTestInstance::nextMemoryType(MemoryTestInstance *this)

{
  uint uVar1;
  uint uVar2;
  code *pcVar3;
  
  resetResources(this);
  uVar2 = this->m_memoryTypeNdx + 1;
  this->m_memoryTypeNdx = uVar2;
  uVar1 = (this->m_memoryProperties).memoryTypeCount;
  if (uVar2 < uVar1) {
    this->m_iteration = 0;
    pcVar3 = createCommandsAndAllocateMemory;
  }
  else {
    pcVar3 = (code *)0x0;
  }
  this->m_stage = (StageFunc)pcVar3;
  *(undefined8 *)&this->field_0x258 = 0;
  return uVar2 < uVar1;
}

Assistant:

bool MemoryTestInstance::nextMemoryType (void)
{
	resetResources();

	DE_ASSERT(m_commands.empty());

	m_memoryTypeNdx++;

	if (m_memoryTypeNdx < m_memoryProperties.memoryTypeCount)
	{
		m_iteration	= 0;
		m_stage		= &MemoryTestInstance::createCommandsAndAllocateMemory;

		return true;
	}
	else
	{
		m_stage = DE_NULL;
		return false;
	}
}